

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::DistantLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,DistantLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  SampledSpectrum SVar20;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar1 = this->scale;
  fVar2 = this->sceneRadius;
  auVar15 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar11 = ZEXT856(auVar6._8_8_);
  auVar16 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar14._0_12_ = ZEXT812(0);
  auVar14._12_4_ = 0;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar14,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar8 = (undefined1  [56])0x0;
  fVar4 = auVar9._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][2];
  SVar20 = DenselySampledSpectrum::Sample(&this->Lemit,&lambda);
  auVar10._0_8_ = SVar20.values.values._8_8_;
  auVar10._8_56_ = auVar11;
  auVar7._0_8_ = SVar20.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  local_58 = auVar6._0_4_;
  fStack_54 = auVar6._4_4_;
  fStack_50 = auVar6._8_4_;
  fStack_4c = auVar6._12_4_;
  auVar18._0_4_ = local_58 * 0.0;
  auVar18._4_4_ = fStack_54 * 0.0;
  auVar18._8_4_ = fStack_50 * 0.0;
  auVar18._12_4_ = fStack_4c * 0.0;
  auVar6 = vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  auVar15 = vfmadd231ps_fma(auVar18,ZEXT816(0) << 0x40,auVar15);
  local_48 = auVar16._0_4_;
  fStack_44 = auVar16._4_4_;
  fStack_40 = auVar16._8_4_;
  fStack_3c = auVar16._12_4_;
  auVar17._0_4_ = auVar15._0_4_ + local_48;
  auVar17._4_4_ = auVar15._4_4_ + fStack_44;
  auVar17._8_4_ = auVar15._8_4_ + fStack_40;
  auVar17._12_4_ = auVar15._12_4_ + fStack_3c;
  fVar2 = fVar2 + fVar2;
  auVar15._0_4_ = auVar17._0_4_ * auVar17._0_4_;
  auVar15._4_4_ = auVar17._4_4_ * auVar17._4_4_;
  auVar15._8_4_ = auVar17._8_4_ * auVar17._8_4_;
  auVar15._12_4_ = auVar17._12_4_ * auVar17._12_4_;
  auVar15 = vhaddps_avx(auVar15,auVar15);
  auVar15 = ZEXT416((uint)(auVar15._0_4_ + fVar4 * fVar4));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  fVar13 = auVar15._0_4_;
  auVar19._4_4_ = fVar13;
  auVar19._0_4_ = fVar13;
  auVar19._8_4_ = fVar13;
  auVar19._12_4_ = fVar13;
  auVar15 = vdivps_avx(auVar17,auVar19);
  fVar5 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
          0.5 + auVar15._0_4_ * fVar2;
  auVar16 = vmovshdup_avx(auVar15);
  auVar12._4_4_ = fVar5;
  auVar12._0_4_ = fVar5;
  auVar12._8_4_ = fVar5;
  auVar12._12_4_ = fVar5;
  fVar5 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
          0.5 + auVar16._0_4_ * fVar2;
  fVar2 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          0.5 + (fVar4 / fVar13) * fVar2;
  auVar16._4_4_ = fVar5;
  auVar16._0_4_ = fVar5;
  auVar16._8_4_ = fVar5;
  auVar16._12_4_ = fVar5;
  auVar9._4_4_ = fVar2;
  auVar9._0_4_ = fVar2;
  auVar9._8_4_ = fVar2;
  auVar9._12_4_ = fVar2;
  auVar16 = vmovlhps_avx(auVar12,auVar16);
  *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20;
  __return_storage_ptr__->set = true;
  *(float *)&__return_storage_ptr__->optionalValue = auVar6._0_4_ * fVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar6._4_4_ * fVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar6._8_4_ * fVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar6._12_4_ * fVar1;
  uVar3 = vmovlps_avx(auVar15);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar3;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar4 / fVar13;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar16;
  uVar3 = vmovlps_avx(auVar9);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar3;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Vector3f wi = Normalize(renderFromLight(Vector3f(0, 0, 1)));
        Point3f pOutside = ctx.p() + wi * (2 * sceneRadius);
        return LightLiSample(scale * Lemit.Sample(lambda), wi, 1,
                             Interaction(pOutside, &mediumInterface));
    }